

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O1

void __thiscall ot::commissioner::tlv::Tlv::Serialize(Tlv *this,ByteArray *aBuf)

{
  bool bVar1;
  
  bVar1 = IsValid(this);
  if (bVar1) {
    utils::Encode<unsigned_char>(aBuf,this->mType);
    if (((ulong)this->mType < 0x40) &&
       ((0x8001000000020000U >> ((ulong)this->mType & 0x3f) & 1) != 0)) {
      utils::Encode<unsigned_char>(aBuf,0xff);
      utils::Encode<unsigned_short>
                (aBuf,(short)*(undefined4 *)
                              &(this->mValue).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                      (short)*(undefined4 *)
                              &(this->mValue).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start);
    }
    else {
      utils::Encode<unsigned_char>
                (aBuf,(char)*(undefined4 *)
                             &(this->mValue).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                      (char)*(undefined4 *)
                             &(this->mValue).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    }
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,
               (this->mValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    return;
  }
  __assert_fail("condition",
                "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/tlv.cpp"
                ,0x7c,"void ot::commissioner::tlv::Tlv::Serialize(ByteArray &) const");
}

Assistant:

void Tlv::Serialize(ByteArray &aBuf) const
{
    ASSERT(IsValid());

    utils::Encode(aBuf, utils::to_underlying(GetType()));

    // TODO(wgtdkp): Thread 1.2 allows extended TLVs use
    // the base TLV format if its length does not exceed
    // 254 bytes. But OpenThread currently does not support
    // this kind of encoding.
    if (IsExtendedTlv(mType))
    {
        // if (GetLength() >= kEscapeLength) {
        utils::Encode(aBuf, kEscapeLength);
        utils::Encode(aBuf, GetLength());
    }
    else
    {
        utils::Encode(aBuf, static_cast<uint8_t>(GetLength()));
    }

    aBuf.insert(aBuf.end(), mValue.begin(), mValue.end());
}